

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_init_file__internal_FILE
                    (ma_dr_wav *pWav,FILE *pFile,ma_dr_wav_chunk_proc onChunk,void *pChunkUserData,
                    ma_uint32 flags,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  ma_allocation_callbacks *in_RCX;
  void *in_RDX;
  FILE *in_RSI;
  ma_dr_wav_read_proc in_RDI;
  ma_bool32 result;
  ma_uint32 in_stack_00001204;
  void *in_stack_00001208;
  ma_dr_wav_chunk_proc in_stack_00001210;
  ma_dr_wav *in_stack_00001218;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mVar1 = ma_dr_wav_preinit((ma_dr_wav *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (ma_dr_wav_seek_proc)in_RSI,in_RDX,in_RCX);
  if (mVar1 == 1) {
    mVar1 = ma_dr_wav_init__internal
                      (in_stack_00001218,in_stack_00001210,in_stack_00001208,in_stack_00001204);
    if (mVar1 == 1) {
      mVar1 = 1;
    }
    else {
      fclose(in_RSI);
    }
  }
  else {
    fclose(in_RSI);
  }
  return mVar1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_init_file__internal_FILE(ma_dr_wav* pWav, FILE* pFile, ma_dr_wav_chunk_proc onChunk, void* pChunkUserData, ma_uint32 flags, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_bool32 result;
    result = ma_dr_wav_preinit(pWav, ma_dr_wav__on_read_stdio, ma_dr_wav__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    result = ma_dr_wav_init__internal(pWav, onChunk, pChunkUserData, flags);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    return MA_TRUE;
}